

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  size_t consumed;
  size_t local_40;
  size_t *local_38;
  
  if (tls->state < PTLS_STATE_SERVER_EXPECT_FINISHED) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x920,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
  }
  pvVar1 = (void *)((long)_input + *inlen);
  local_38 = inlen;
  if (*inlen == 0) {
    sVar3 = 0;
    iVar2 = 0;
  }
  else {
    sVar3 = decryptbuf->off;
    while (sVar3 == decryptbuf->off) {
      local_40 = (long)pvVar1 - (long)_input;
      iVar2 = handle_input(tls,(ptls_buffer_t *)0x0,decryptbuf,_input,&local_40,
                           (ptls_handshake_properties_t *)0x0);
      _input = (void *)((long)_input + local_40);
      if (iVar2 == 0x202) {
        iVar2 = 0;
      }
      if ((iVar2 != 0) || (_input == pvVar1)) goto LAB_0010f969;
    }
    iVar2 = 0;
LAB_0010f969:
    sVar3 = *local_38;
  }
  *local_38 = (long)_input + (sVar3 - (long)pvVar1);
  return iVar2;
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED);

    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_HANDSHAKE_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}